

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

bool __thiscall
google::
dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
::unserialize<ValueSerializer,_IO_FILE>
          (dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           *this,FILE *param_2)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  int bit;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uchar bits;
  size_type new_num_buckets;
  MagicNumberType magic_read;
  byte local_52;
  ValueSerializer local_51;
  FILE *local_50;
  long local_48;
  size_type local_40;
  unsigned_long local_38;
  
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::clear((dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
           *)this);
  bVar2 = sparsehash_internal::read_bigendian_number<_IO_FILE,unsigned_long>
                    ((_IO_FILE *)param_2,&local_38,4);
  if (((bVar2) && (local_38 == 0x13578642)) &&
     (bVar2 = sparsehash_internal::read_bigendian_number<_IO_FILE,unsigned_long>
                        ((_IO_FILE *)param_2,&local_40,8), bVar2)) {
    dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::clear_to_size((dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                     *)this,local_40);
    bVar2 = sparsehash_internal::read_bigendian_number<_IO_FILE,unsigned_long>
                      ((_IO_FILE *)param_2,(unsigned_long *)(this + 0x58),8);
    if (bVar2) {
      bVar2 = *(long *)(this + 0x60) == 0;
      if (bVar2) {
        return bVar2;
      }
      lVar6 = 0;
      uVar7 = 0;
      local_50 = param_2;
      do {
        sVar4 = fread(&local_52,1,1,local_50);
        bVar1 = local_52;
        if (sVar4 != 1) {
          return bVar2;
        }
        lVar5 = 0;
        local_48 = lVar6;
        do {
          if (((uVar7 + lVar5 < *(ulong *)(this + 0x60)) &&
              ((bVar1 >> ((uint)lVar5 & 0x1f) & 1) != 0)) &&
             (bVar3 = ValueSerializer::operator()
                                (&local_51,(_IO_FILE *)local_50,
                                 (pair<const_char_*const,_ValueType> *)
                                 (*(long *)(this + 0x78) + lVar6)), !bVar3)) {
            return bVar2;
          }
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar5 != 8);
        uVar7 = uVar7 + 8;
        lVar6 = local_48 + 0x80;
        bVar2 = *(ulong *)(this + 0x60) <= uVar7;
        if (bVar2) {
          return bVar2;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool unserialize(ValueSerializer serializer, INPUT* fp) {
    assert(settings.use_empty() && "empty_key not set for read");

    clear();  // just to be consistent
    MagicNumberType magic_read;
    if (!sparsehash_internal::read_bigendian_number(fp, &magic_read, 4))
      return false;
    if (magic_read != MAGIC_NUMBER) {
      return false;
    }
    size_type new_num_buckets;
    if (!sparsehash_internal::read_bigendian_number(fp, &new_num_buckets, 8))
      return false;
    clear_to_size(new_num_buckets);
    if (!sparsehash_internal::read_bigendian_number(fp, &num_elements, 8))
      return false;

    // Read the bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits;
      if (!sparsehash_internal::read_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && (bits & (1 << bit))) {  // not empty
          if (!serializer(fp, &table[i + bit])) return false;
        }
      }
    }
    return true;
  }